

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

positionTy * DataRefs::GetViewPos(void)

{
  bool bVar1;
  long lVar2;
  positionTy *ppVar3;
  positionTy *in_RDI;
  positionTy *ppVar4;
  byte bVar5;
  unique_lock<std::recursive_mutex> lock;
  
  bVar5 = 0;
  bVar1 = IsXPThread(&dataRefs);
  if (bVar1) {
    ppVar3 = &lastCamPos;
    ppVar4 = in_RDI;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      ppVar4->_lat = ppVar3->_lat;
      ppVar3 = (positionTy *)((long)ppVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::unique_lock(&lock,&mutexDrUpdate);
    ppVar3 = &lastCamPos;
    ppVar4 = in_RDI;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      ppVar4->_lat = ppVar3->_lat;
      ppVar3 = (positionTy *)((long)ppVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    std::unique_lock<std::recursive_mutex>::unlock(&lock);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  }
  return in_RDI;
}

Assistant:

positionTy DataRefs::GetViewPos()
{
    // If in main thread just return latest pos
    if (dataRefs.IsXPThread())
        return lastCamPos;
    else
    {
        // calling from another thread: safely copy the cached value
        std::unique_lock<std::recursive_mutex> lock(mutexDrUpdate);
        positionTy camPos = lastCamPos;
        lock.unlock();
        return camPos;
    }
}